

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

int create_render_pass(Init *init,RenderData *data)

{
  VkResult VVar1;
  undefined1 local_f8 [8];
  VkRenderPassCreateInfo render_pass_info;
  VkSubpassDependency dependency;
  VkSubpassDescription subpass;
  VkAttachmentReference color_attachment_ref;
  VkAttachmentDescription color_attachment;
  RenderData *data_local;
  Init *init_local;
  
  memset(&color_attachment_ref,0,0x24);
  color_attachment_ref.layout = (init->swapchain).image_format;
  memset((void *)((long)&subpass.pPreserveAttachments + 4),0,8);
  subpass.pPreserveAttachments._4_4_ = 0;
  memset(&dependency.dstAccessMask,0,0x48);
  dependency.dependencyFlags = 0;
  subpass.pInputAttachments._0_4_ = 1;
  subpass._24_8_ = (long)&subpass.pPreserveAttachments + 4;
  memset((void *)((long)&render_pass_info.pDependencies + 4),0,0x1c);
  render_pass_info.pDependencies._4_4_ = 0xffffffff;
  dependency.srcSubpass = 0x400;
  dependency.srcStageMask = 0;
  dependency.dstSubpass = 0x400;
  dependency.dstStageMask = 0x180;
  memset(local_f8,0,0x40);
  local_f8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  render_pass_info.pNext._4_4_ = 1;
  render_pass_info._16_8_ = &color_attachment_ref;
  render_pass_info.pAttachments._0_4_ = 1;
  render_pass_info._32_8_ = &dependency.dstAccessMask;
  render_pass_info.pSubpasses._0_4_ = 1;
  render_pass_info._48_8_ = (long)&render_pass_info.pDependencies + 4;
  VVar1 = vkb::DispatchTable::createRenderPass
                    (&init->disp,(VkRenderPassCreateInfo *)local_f8,(VkAllocationCallbacks *)0x0,
                     &data->render_pass);
  if (VVar1 == VK_SUCCESS) {
    init_local._4_4_ = 0;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to create render pass\n");
    init_local._4_4_ = -1;
  }
  return init_local._4_4_;
}

Assistant:

int create_render_pass(Init& init, RenderData& data) {
    VkAttachmentDescription color_attachment = {};
    color_attachment.format = init.swapchain.image_format;
    color_attachment.samples = VK_SAMPLE_COUNT_1_BIT;
    color_attachment.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
    color_attachment.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    color_attachment.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
    color_attachment.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
    color_attachment.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    color_attachment.finalLayout = VK_IMAGE_LAYOUT_PRESENT_SRC_KHR;

    VkAttachmentReference color_attachment_ref = {};
    color_attachment_ref.attachment = 0;
    color_attachment_ref.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;

    VkSubpassDescription subpass = {};
    subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpass.colorAttachmentCount = 1;
    subpass.pColorAttachments = &color_attachment_ref;

    VkSubpassDependency dependency = {};
    dependency.srcSubpass = VK_SUBPASS_EXTERNAL;
    dependency.dstSubpass = 0;
    dependency.srcStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
    dependency.srcAccessMask = 0;
    dependency.dstStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
    dependency.dstAccessMask = VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;

    VkRenderPassCreateInfo render_pass_info = {};
    render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    render_pass_info.attachmentCount = 1;
    render_pass_info.pAttachments = &color_attachment;
    render_pass_info.subpassCount = 1;
    render_pass_info.pSubpasses = &subpass;
    render_pass_info.dependencyCount = 1;
    render_pass_info.pDependencies = &dependency;

    if (init.disp.createRenderPass(&render_pass_info, nullptr, &data.render_pass) != VK_SUCCESS) {
        std::cout << "failed to create render pass\n";
        return -1; // failed to create render pass!
    }
    return 0;
}